

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printUImm12Offset2(MCInst *MI,uint OpNum,SStream *O,int Scale)

{
  int Scale_local;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  printUImm12Offset(MI,OpNum,Scale,O);
  return;
}

Assistant:

static void printUImm12Offset2(MCInst *MI, unsigned OpNum, SStream *O, int Scale)
{
	printUImm12Offset(MI, OpNum, Scale, O);
}